

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ParameterDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ParameterDeclarationSyntax,slang::parsing::Token&,slang::syntax::DataTypeSyntax&,slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>const&>
          (BumpAllocator *this,Token *args,DataTypeSyntax *args_1,
          SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *args_2)

{
  Token keyword;
  ParameterDeclarationSyntax *pPVar1;
  size_t in_RCX;
  BumpAllocator *in_RDX;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *in_stack_00000010;
  size_t in_stack_ffffffffffffffd8;
  
  pPVar1 = (ParameterDeclarationSyntax *)allocate(in_RDX,in_RCX,in_stack_ffffffffffffffd8);
  keyword.info = (Info *)this;
  keyword._0_8_ = args;
  slang::syntax::ParameterDeclarationSyntax::ParameterDeclarationSyntax
            ((ParameterDeclarationSyntax *)args_1,keyword,(DataTypeSyntax *)args_2,in_stack_00000010
            );
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }